

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O0

Score __thiscall
indigox::algorithm::FPTOptimisation::ScoreVertex(FPTOptimisation *this,MolVertPair v,VertMask *f)

{
  Score SVar1;
  size_type sVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  ElectronOptimisationAlgorithm *in_RDX;
  key_type *in_RDI;
  ElnVertex u;
  ElnDist *in_stack_00000038;
  ElnDist actualDist;
  VertMask placed;
  Score s;
  ElnVertex *in_stack_00000120;
  ElectronOptimisationAlgorithm *in_stack_00000128;
  map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  *in_stack_ffffffffffffff70;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  SVar1 = Options::AssignElectrons::INF;
  boost::operator&(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(in_RCX);
  if (sVar2 <= *in_RDI->second) {
    VertMaskToElnDist((FPTOptimisation *)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (VertMask *)in_RDX);
    std::
    map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
    ::at(in_stack_ffffffffffffff70,in_RDI);
    ElectronOptimisationAlgorithm::SetElectronDistribution
              ((ElectronOptimisationAlgorithm *)
               actualDist.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,in_stack_00000038);
    ElectronOptimisationAlgorithm::DetermineFormalCharges(in_RDX);
    SVar1 = ElectronOptimisationAlgorithm::CalculateVertexEnergy
                      (in_stack_00000128,in_stack_00000120);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15d214);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15d24a);
  return SVar1;
}

Assistant:

Score FPTOptimisation::ScoreVertex(MolVertPair v, VertMask f)
{  
  Score s = opt_::INF;
  const VertMask placed = f & placedMask_;
  if (placed.count() > parent_->electronsToAdd_) return s;
  
  ElnDist actualDist = VertMaskToElnDist(placed);
  
  ElnVertex u = mvp2ev_.at(v);
  SetElectronDistribution(actualDist);
  DetermineFormalCharges();
  s = CalculateVertexEnergy(u);
  return s;
}